

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_int128_impl.h
# Opt level: O0

void secp256k1_fe_mul_inner(uint64_t *r,uint64_t *a,uint64_t *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ulong uVar65;
  ulong uVar66;
  uint64_t R;
  uint64_t M;
  uint64_t a4;
  uint64_t a3;
  uint64_t a2;
  uint64_t a1;
  uint64_t a0;
  uint64_t u0;
  uint64_t tx;
  uint64_t t4;
  uint64_t t3;
  uint128_t d;
  uint128_t c;
  uint64_t *b_local;
  uint64_t *a_local;
  uint64_t *r_local;
  
  uVar1 = *a;
  uVar2 = a[1];
  uVar3 = a[2];
  uVar4 = a[3];
  uVar5 = a[4];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = b[3];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = b[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = b[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar4;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *b;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar5;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = b[4];
  d._8_8_ = SUB168(auVar10 * auVar41,0);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = d._8_8_ & 0xfffffffffffff;
  auVar6 = auVar11 * ZEXT816(0x1000003d10) +
           auVar9 * auVar40 + auVar8 * auVar39 + auVar7 * auVar38 + auVar6 * auVar37;
  auVar7 = auVar10 * auVar41 >> 0x34;
  t3 = auVar6._0_8_;
  uVar65 = t3 & 0xfffffffffffff;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = b[4];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = b[3];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar3;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = b[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar4;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = b[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar5;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *b;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar7._0_8_;
  auVar63._8_8_ = SUB168(auVar17 * ZEXT816(0x1000003d10),8) + auVar7._8_8_ * 0x1000003d10;
  auVar63._0_8_ = SUB168(auVar17 * ZEXT816(0x1000003d10),0);
  _t3 = auVar16 * auVar46 +
        auVar15 * auVar45 + auVar14 * auVar44 + auVar13 * auVar43 + auVar12 * auVar42 +
        (auVar6 >> 0x34) + auVar63;
  uVar66 = t3;
  _t3 = _t3 >> 0x34;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *b;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar2;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = b[4];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar3;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = b[3];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar4;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = b[2];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar5;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = b[1];
  _t3 = auVar22 * auVar51 + auVar21 * auVar50 + auVar20 * auVar49 + auVar19 * auVar48 + _t3;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (t3 & 0xfffffffffffff) << 4 | (uVar66 & 0xfffffffffffff) >> 0x30;
  auVar6 = auVar23 * ZEXT816(0x1000003d1) + auVar18 * auVar47;
  d._8_8_ = auVar6._0_8_;
  *r = d._8_8_ & 0xfffffffffffff;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar1;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = b[1];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar2;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *b;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar3;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = b[4];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar4;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = b[3];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar5;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = b[2];
  auVar7 = auVar28 * auVar56 + auVar27 * auVar55 + auVar26 * auVar54 + (_t3 >> 0x34);
  t3 = auVar7._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = t3 & 0xfffffffffffff;
  auVar6 = auVar29 * ZEXT816(0x1000003d10) +
           auVar25 * auVar53 + auVar24 * auVar52 + (auVar6 >> 0x34);
  d._8_8_ = auVar6._0_8_;
  r[1] = d._8_8_ & 0xfffffffffffff;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar1;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = b[2];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar2;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = b[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar3;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *b;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar4;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = b[4];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar5;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = b[3];
  auVar7 = auVar34 * auVar61 + auVar33 * auVar60 + (auVar7 >> 0x34);
  t3 = auVar7._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = t3 & 0xfffffffffffff;
  auVar6 = auVar35 * ZEXT816(0x1000003d10) +
           auVar32 * auVar59 + auVar31 * auVar58 + auVar30 * auVar57 + (auVar6 >> 0x34);
  auVar7 = auVar7 >> 0x34;
  d._8_8_ = auVar6._0_8_;
  r[2] = d._8_8_ & 0xfffffffffffff;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar7._0_8_;
  auVar62._8_8_ = auVar7._8_8_ * 0x1000003d10;
  auVar62._0_8_ = uVar65;
  auVar6 = auVar36 * ZEXT816(0x1000003d10) + auVar62 + (auVar6 >> 0x34);
  d._8_8_ = auVar6._0_8_;
  r[3] = d._8_8_ & 0xfffffffffffff;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar66 & 0xffffffffffff;
  r[4] = SUB168((auVar6 >> 0x34) + auVar64,0);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul_inner(uint64_t *r, const uint64_t *a, const uint64_t * SECP256K1_RESTRICT b) {
    uint128_t c, d;
    uint64_t t3, t4, tx, u0;
    uint64_t a0 = a[0], a1 = a[1], a2 = a[2], a3 = a[3], a4 = a[4];
    const uint64_t M = 0xFFFFFFFFFFFFFULL, R = 0x1000003D10ULL;

    VERIFY_BITS(a[0], 56);
    VERIFY_BITS(a[1], 56);
    VERIFY_BITS(a[2], 56);
    VERIFY_BITS(a[3], 56);
    VERIFY_BITS(a[4], 52);
    VERIFY_BITS(b[0], 56);
    VERIFY_BITS(b[1], 56);
    VERIFY_BITS(b[2], 56);
    VERIFY_BITS(b[3], 56);
    VERIFY_BITS(b[4], 52);
    VERIFY_CHECK(r != b);
    VERIFY_CHECK(a != b);

    /*  [... a b c] is a shorthand for ... + a<<104 + b<<52 + c<<0 mod n.
     *  for 0 <= x <= 4, px is a shorthand for sum(a[i]*b[x-i], i=0..x).
     *  for 4 <= x <= 8, px is a shorthand for sum(a[i]*b[x-i], i=(x-4)..4)
     *  Note that [x 0 0 0 0 0] = [x*R].
     */

    d  = (uint128_t)a0 * b[3]
       + (uint128_t)a1 * b[2]
       + (uint128_t)a2 * b[1]
       + (uint128_t)a3 * b[0];
    VERIFY_BITS(d, 114);
    /* [d 0 0 0] = [p3 0 0 0] */
    c  = (uint128_t)a4 * b[4];
    VERIFY_BITS(c, 112);
    /* [c 0 0 0 0 d 0 0 0] = [p8 0 0 0 0 p3 0 0 0] */
    d += (c & M) * R; c >>= 52;
    VERIFY_BITS(d, 115);
    VERIFY_BITS(c, 60);
    /* [c 0 0 0 0 0 d 0 0 0] = [p8 0 0 0 0 p3 0 0 0] */
    t3 = d & M; d >>= 52;
    VERIFY_BITS(t3, 52);
    VERIFY_BITS(d, 63);
    /* [c 0 0 0 0 d t3 0 0 0] = [p8 0 0 0 0 p3 0 0 0] */

    d += (uint128_t)a0 * b[4]
       + (uint128_t)a1 * b[3]
       + (uint128_t)a2 * b[2]
       + (uint128_t)a3 * b[1]
       + (uint128_t)a4 * b[0];
    VERIFY_BITS(d, 115);
    /* [c 0 0 0 0 d t3 0 0 0] = [p8 0 0 0 p4 p3 0 0 0] */
    d += c * R;
    VERIFY_BITS(d, 116);
    /* [d t3 0 0 0] = [p8 0 0 0 p4 p3 0 0 0] */
    t4 = d & M; d >>= 52;
    VERIFY_BITS(t4, 52);
    VERIFY_BITS(d, 64);
    /* [d t4 t3 0 0 0] = [p8 0 0 0 p4 p3 0 0 0] */
    tx = (t4 >> 48); t4 &= (M >> 4);
    VERIFY_BITS(tx, 4);
    VERIFY_BITS(t4, 48);
    /* [d t4+(tx<<48) t3 0 0 0] = [p8 0 0 0 p4 p3 0 0 0] */

    c  = (uint128_t)a0 * b[0];
    VERIFY_BITS(c, 112);
    /* [d t4+(tx<<48) t3 0 0 c] = [p8 0 0 0 p4 p3 0 0 p0] */
    d += (uint128_t)a1 * b[4]
       + (uint128_t)a2 * b[3]
       + (uint128_t)a3 * b[2]
       + (uint128_t)a4 * b[1];
    VERIFY_BITS(d, 115);
    /* [d t4+(tx<<48) t3 0 0 c] = [p8 0 0 p5 p4 p3 0 0 p0] */
    u0 = d & M; d >>= 52;
    VERIFY_BITS(u0, 52);
    VERIFY_BITS(d, 63);
    /* [d u0 t4+(tx<<48) t3 0 0 c] = [p8 0 0 p5 p4 p3 0 0 p0] */
    /* [d 0 t4+(tx<<48)+(u0<<52) t3 0 0 c] = [p8 0 0 p5 p4 p3 0 0 p0] */
    u0 = (u0 << 4) | tx;
    VERIFY_BITS(u0, 56);
    /* [d 0 t4+(u0<<48) t3 0 0 c] = [p8 0 0 p5 p4 p3 0 0 p0] */
    c += (uint128_t)u0 * (R >> 4);
    VERIFY_BITS(c, 115);
    /* [d 0 t4 t3 0 0 c] = [p8 0 0 p5 p4 p3 0 0 p0] */
    r[0] = c & M; c >>= 52;
    VERIFY_BITS(r[0], 52);
    VERIFY_BITS(c, 61);
    /* [d 0 t4 t3 0 c r0] = [p8 0 0 p5 p4 p3 0 0 p0] */

    c += (uint128_t)a0 * b[1]
       + (uint128_t)a1 * b[0];
    VERIFY_BITS(c, 114);
    /* [d 0 t4 t3 0 c r0] = [p8 0 0 p5 p4 p3 0 p1 p0] */
    d += (uint128_t)a2 * b[4]
       + (uint128_t)a3 * b[3]
       + (uint128_t)a4 * b[2];
    VERIFY_BITS(d, 114);
    /* [d 0 t4 t3 0 c r0] = [p8 0 p6 p5 p4 p3 0 p1 p0] */
    c += (d & M) * R; d >>= 52;
    VERIFY_BITS(c, 115);
    VERIFY_BITS(d, 62);
    /* [d 0 0 t4 t3 0 c r0] = [p8 0 p6 p5 p4 p3 0 p1 p0] */
    r[1] = c & M; c >>= 52;
    VERIFY_BITS(r[1], 52);
    VERIFY_BITS(c, 63);
    /* [d 0 0 t4 t3 c r1 r0] = [p8 0 p6 p5 p4 p3 0 p1 p0] */

    c += (uint128_t)a0 * b[2]
       + (uint128_t)a1 * b[1]
       + (uint128_t)a2 * b[0];
    VERIFY_BITS(c, 114);
    /* [d 0 0 t4 t3 c r1 r0] = [p8 0 p6 p5 p4 p3 p2 p1 p0] */
    d += (uint128_t)a3 * b[4]
       + (uint128_t)a4 * b[3];
    VERIFY_BITS(d, 114);
    /* [d 0 0 t4 t3 c t1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
    c += (d & M) * R; d >>= 52;
    VERIFY_BITS(c, 115);
    VERIFY_BITS(d, 62);
    /* [d 0 0 0 t4 t3 c r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */

    /* [d 0 0 0 t4 t3 c r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
    r[2] = c & M; c >>= 52;
    VERIFY_BITS(r[2], 52);
    VERIFY_BITS(c, 63);
    /* [d 0 0 0 t4 t3+c r2 r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
    c   += d * R + t3;
    VERIFY_BITS(c, 100);
    /* [t4 c r2 r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
    r[3] = c & M; c >>= 52;
    VERIFY_BITS(r[3], 52);
    VERIFY_BITS(c, 48);
    /* [t4+c r3 r2 r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
    c   += t4;
    VERIFY_BITS(c, 49);
    /* [c r3 r2 r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
    r[4] = c;
    VERIFY_BITS(r[4], 49);
    /* [r4 r3 r2 r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
}